

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

int Bmc_ComputeSimDiff(Gia_Man_t *p,Vec_Int_t *vPat,Vec_Int_t *vPat2)

{
  Vec_Wrd_t *pVVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  word wVar6;
  bool bVar7;
  word local_98;
  ulong local_80;
  ulong local_78;
  word Sim1;
  word Sim0;
  word Sim;
  int Id;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vPat2_local;
  Vec_Int_t *vPat_local;
  Gia_Man_t *p_local;
  
  Sim._4_4_ = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCis);
    bVar7 = false;
    if (Sim._4_4_ < iVar2) {
      pGVar4 = Gia_ManCi(p,Sim._4_4_);
      Sim._0_4_ = Gia_ObjId(p,pGVar4);
      bVar7 = (int)Sim != 0;
    }
    if (!bVar7) break;
    iVar2 = Vec_IntEntry(vPat,Sim._4_4_);
    uVar5 = 0;
    if (iVar2 != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    Vec_WrdWriteEntry(p->vSims,(int)Sim,1L << ((char)Sim._4_4_ + 1U & 0x3f) ^ uVar5);
    Sim._4_4_ = Sim._4_4_ + 1;
  }
  Sim._4_4_ = 0;
  while( true ) {
    bVar7 = false;
    if (Sim._4_4_ < p->nObjs) {
      _Id = Gia_ManObj(p,Sim._4_4_);
      bVar7 = _Id != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar2 = Gia_ObjIsAnd(_Id);
    if (iVar2 != 0) {
      pVVar1 = p->vSims;
      iVar2 = Gia_ObjFaninId0(_Id,Sim._4_4_);
      local_78 = Vec_WrdEntry(pVVar1,iVar2);
      pVVar1 = p->vSims;
      iVar2 = Gia_ObjFaninId1(_Id,Sim._4_4_);
      local_80 = Vec_WrdEntry(pVVar1,iVar2);
      iVar2 = Gia_ObjFaninC0(_Id);
      if (iVar2 != 0) {
        local_78 = local_78 ^ 0xffffffffffffffff;
      }
      iVar2 = Gia_ObjFaninC1(_Id);
      if (iVar2 != 0) {
        local_80 = local_80 ^ 0xffffffffffffffff;
      }
      Vec_WrdWriteEntry(p->vSims,Sim._4_4_,local_78 & local_80);
    }
    Sim._4_4_ = Sim._4_4_ + 1;
  }
  Sim._4_4_ = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCos);
    bVar7 = false;
    if (Sim._4_4_ < iVar2) {
      _Id = Gia_ManCo(p,Sim._4_4_);
      bVar7 = _Id != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar2 = Gia_ObjId(p,_Id);
    pVVar1 = p->vSims;
    iVar3 = Gia_ObjFaninId0(_Id,iVar2);
    local_98 = Vec_WrdEntry(pVVar1,iVar3);
    iVar3 = Gia_ObjFaninC0(_Id);
    if (iVar3 != 0) {
      local_98 = local_98 ^ 0xffffffffffffffff;
    }
    Vec_WrdWriteEntry(p->vSims,iVar2,local_98);
    Sim._4_4_ = Sim._4_4_ + 1;
  }
  pGVar4 = Gia_ManCo(p,0);
  pVVar1 = p->vSims;
  iVar2 = Gia_ObjId(p,pGVar4);
  wVar6 = Vec_WrdEntry(pVVar1,iVar2);
  Vec_IntClear(vPat2);
  Sim._4_4_ = 1;
  while( true ) {
    iVar2 = Gia_ManCiNum(p);
    if (iVar2 < Sim._4_4_) break;
    Vec_IntPush(vPat2,(uint)wVar6 & 1 ^ (uint)(wVar6 >> ((byte)Sim._4_4_ & 0x3f)) & 1);
    Sim._4_4_ = Sim._4_4_ + 1;
  }
  return (uint)wVar6 & 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [For a given random pattern, compute output change.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Bmc_ComputeSimDiff( Gia_Man_t * p, Vec_Int_t * vPat, Vec_Int_t * vPat2 )
{
    Gia_Obj_t * pObj;
    int i, Id; word Sim, Sim0, Sim1;
    Gia_ManForEachCiId( p, Id, i )
    {
        Sim = Vec_IntEntry(vPat, i) ? ~(word)0 : 0;
        Sim ^= (word)1 << (i + 1);
        Vec_WrdWriteEntry( p->vSims, Id, Sim );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        Sim0 = Vec_WrdEntry( p->vSims, Gia_ObjFaninId0(pObj, i) );
        Sim1 = Vec_WrdEntry( p->vSims, Gia_ObjFaninId1(pObj, i) );
        Sim0 = Gia_ObjFaninC0(pObj) ? ~Sim0 : Sim0;
        Sim1 = Gia_ObjFaninC1(pObj) ? ~Sim1 : Sim1;
        Vec_WrdWriteEntry( p->vSims, i, Sim0 & Sim1 );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        Id = Gia_ObjId( p, pObj );
        Sim0 = Vec_WrdEntry( p->vSims, Gia_ObjFaninId0(pObj, Id) );
        Sim0 = Gia_ObjFaninC0(pObj) ? ~Sim0 : Sim0;
        Vec_WrdWriteEntry( p->vSims, Id, Sim0 );
    }
    pObj = Gia_ManCo( p, 0 );
    Sim = Vec_WrdEntry( p->vSims, Gia_ObjId(p, pObj) );
    Vec_IntClear( vPat2 );
    for ( i = 1; i <= Gia_ManCiNum(p); i++ )
        Vec_IntPush( vPat2, (int)((Sim & 1) ^ ((Sim >> i) & 1)) );
    return (int)(Sim & 1);
}